

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_unify(nk_rect *clip,nk_rect *a,float x0,float y0,float x1,float y1)

{
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  nk_rect *a_local;
  nk_rect *clip_local;
  
  local_24 = x0;
  if (x0 <= a->x) {
    local_24 = a->x;
  }
  clip->x = local_24;
  local_28 = y0;
  if (y0 <= a->y) {
    local_28 = a->y;
  }
  clip->y = local_28;
  local_2c = x1;
  if (a->x + a->w < x1) {
    local_2c = a->x + a->w;
  }
  clip->w = local_2c - clip->x;
  local_30 = y1;
  if (a->y + a->h < y1) {
    local_30 = a->y + a->h;
  }
  clip->h = local_30 - clip->y;
  if (clip->w <= 0.0) {
    local_34 = 0.0;
  }
  else {
    local_34 = clip->w;
  }
  clip->w = local_34;
  if (clip->h <= 0.0) {
    local_38 = 0.0;
  }
  else {
    local_38 = clip->h;
  }
  clip->h = local_38;
  return;
}

Assistant:

NK_LIB void
nk_unify(struct nk_rect *clip, const struct nk_rect *a, float x0, float y0,
float x1, float y1)
{
NK_ASSERT(a);
NK_ASSERT(clip);
clip->x = NK_MAX(a->x, x0);
clip->y = NK_MAX(a->y, y0);
clip->w = NK_MIN(a->x + a->w, x1) - clip->x;
clip->h = NK_MIN(a->y + a->h, y1) - clip->y;
clip->w = NK_MAX(0, clip->w);
clip->h = NK_MAX(0, clip->h);
}